

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

UINT8 __thiscall PlayerA::Seek(PlayerA *this,UINT8 unit,UINT32 pos)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RCX;
  UINT32 pbSmpl;
  UINT8 retVal;
  UINT32 pos_local;
  UINT8 unit_local;
  PlayerA *this_local;
  
  if (this->_player == (PlayerBase *)0x0) {
    this_local._7_1_ = 0xff;
  }
  else {
    iVar1 = (*this->_player->_vptr_PlayerBase[0x22])
                      (this->_player,(ulong)unit,(ulong)pos,
                       CONCAT71((int7)((ulong)in_RCX >> 8),unit));
    this_local._7_1_ = (UINT8)iVar1;
    iVar1 = (*this->_player->_vptr_PlayerBase[0x19])();
    this->_myPlayState = (byte)iVar1 & 3;
    uVar2 = (*this->_player->_vptr_PlayerBase[0x1a])(this->_player,2);
    if (uVar2 < this->_fadeSmplStart) {
      this->_fadeSmplStart = 0xffffffff;
    }
    if (uVar2 < this->_endSilenceStart) {
      this->_endSilenceStart = 0xffffffff;
    }
  }
  return this_local._7_1_;
}

Assistant:

UINT8 PlayerA::Seek(UINT8 unit, UINT32 pos)
{
	if (_player == NULL)
		return 0xFF;
	UINT8 retVal = _player->Seek(unit, pos);
	_myPlayState = _player->GetState() & (PLAYSTATE_PLAY | PLAYSTATE_END);
	
	UINT32 pbSmpl = _player->GetCurPos(PLAYPOS_SAMPLE);
	if (pbSmpl < _fadeSmplStart)
		_fadeSmplStart = (UINT32)-1;
	if (pbSmpl < _endSilenceStart)
		_endSilenceStart = (UINT32)-1;
	return retVal;
}